

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase41::run(TestCase41 *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Schema SVar3;
  StructSchema SVar4;
  bool bVar5;
  Reader RVar6;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StructSchema schema;
  Field field;
  Fault f;
  Field lookup;
  CapTableReader local_270;
  undefined1 local_268 [20];
  undefined4 uStack_254;
  uint uStack_250;
  BitsPerElementN<23> BStack_24c;
  void *local_240;
  short local_234;
  undefined4 local_230;
  Fault local_228;
  uint local_220;
  uint local_21c;
  undefined1 local_218 [16];
  SegmentReader *local_208;
  WirePointer *pWStack_200;
  undefined8 local_1f8;
  WirePointer *pWStack_1f0;
  uint local_1e8;
  undefined1 local_1d8 [40];
  WirePointer *pWStack_1b0;
  undefined1 local_198 [8];
  undefined1 auStack_190 [352];
  
  local_270._vptr_CapTableReader = (_func_int **)(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto((Reader *)local_198,(Schema *)&local_270);
  if ((((uint)auStack_190._24_4_ < 0x40) || (*(long *)auStack_190._8_8_ != -0x5f570ceb47f49c03)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_268._0_8_ = (_func_int **)0xa0a8f314b80b63fd;
    Schema::getProto((Reader *)local_198,(Schema *)&local_270);
    if ((uint)auStack_190._24_4_ < 0x40) {
      local_218._0_8_ = (RawBrandedSchema *)0x0;
    }
    else {
      local_218._0_8_ = *(undefined8 *)auStack_190._8_8_;
    }
    kj::_::Debug::log<char_const(&)[73],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(typeId<TestAllTypes>()) == (schema.getProto().getId())\", typeId<TestAllTypes>(), schema.getProto().getId()"
               ,(char (*) [73])
                "failed: expected (typeId<TestAllTypes>()) == (schema.getProto().getId())",
               (unsigned_long *)local_268,(unsigned_long *)local_218);
  }
  SVar3 = Schema::getDependency((Schema *)&local_270,0x9c8e9318b29d9cd3,0);
  if ((SVar3.raw != (RawBrandedSchema *)(schemas::s_9c8e9318b29d9cd3 + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[86]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2e,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()\""
               ,(char (*) [86])
                "failed: expected schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()"
              );
  }
  SVar3 = Schema::getDependency((Schema *)&local_270,0x9c8e9318b29d9cd3,0);
  if ((SVar3.raw == (RawBrandedSchema *)local_270._vptr_CapTableReader) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[68]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2f,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) != schema\"",
               (char (*) [68])"failed: expected schema.getDependency(typeId<TestEnum>()) != schema")
    ;
  }
  SVar3 = Schema::getDependency((Schema *)&local_270,0xa0a8f314b80b63fd,0);
  if ((SVar3.raw != (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[94]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()\""
               ,(char (*) [94])
                "failed: expected schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()"
              );
  }
  SVar3 = Schema::getDependency((Schema *)&local_270,0xa0a8f314b80b63fd,0);
  if ((SVar3.raw != (RawBrandedSchema *)local_270._vptr_CapTableReader) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x31,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == schema\"",
               (char (*) [72])
               "failed: expected schema.getDependency(typeId<TestAllTypes>()) == schema");
  }
  local_268._0_8_ = &PTR_run_0060bc68;
  local_268._8_8_ = &local_270;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_198,(Runnable *)local_268);
  if (local_198[0] == true) {
    kj::Exception::~Exception((Exception *)(local_198 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[111]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x32,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != nullptr\""
               ,(char (*) [111])
                "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != nullptr"
              );
  }
  SVar4 = Schema::asStruct((Schema *)&local_270);
  if ((SVar4.super_Schema.raw != (Schema)local_270._vptr_CapTableReader) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x34,ERROR,"\"failed: expected \" \"schema.asStruct() == schema\"",
               (char (*) [45])"failed: expected schema.asStruct() == schema");
  }
  local_268._0_8_ = &PTR_run_0060bc98;
  local_268._8_8_ = &local_270;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_198,(Runnable *)local_268);
  if (local_198[0] == true) {
    kj::Exception::~Exception((Exception *)(local_198 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[82]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asEnum(); }) != nullptr\""
               ,(char (*) [82])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asEnum(); }) != nullptr")
    ;
  }
  local_268._0_8_ = &PTR_run_0060bcc8;
  local_268._8_8_ = &local_270;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_198,(Runnable *)local_268);
  if (local_198[0] == true) {
    kj::Exception::~Exception((Exception *)(local_198 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[87]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x36,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asInterface(); }) != nullptr\""
               ,(char (*) [87])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asInterface(); }) != nullptr"
              );
  }
  StructSchema::getFields((FieldList *)local_198,(StructSchema *)&local_270);
  uVar2 = auStack_190._24_4_;
  Schema::getProto((Reader *)local_218,(Schema *)&local_270);
  local_1d8._16_8_ = (SegmentReader *)(pWStack_200 + 3);
  if (local_1f8._4_2_ < 4) {
    local_1d8._16_8_ = (SegmentReader *)0x0;
  }
  if (local_1f8._4_2_ < 4) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    pWStack_1f0._0_4_ = 0x7fffffff;
  }
  else {
    local_1d8._0_4_ = local_218._0_4_;
    local_1d8._4_4_ = local_218._4_4_;
    local_1d8._8_4_ = local_218._8_4_;
    local_1d8._12_4_ = local_218._12_4_;
  }
  local_1d8._24_4_ = (int)pWStack_1f0;
  PointerReader::getList
            ((ListReader *)local_268,(PointerReader *)local_1d8,INLINE_COMPOSITE,(word *)0x0);
  if (uVar2 != uStack_250) {
    StructSchema::getFields((FieldList *)local_198,(StructSchema *)&local_270);
    local_21c = auStack_190._24_4_;
    Schema::getProto((Reader *)local_1d8,(Schema *)&local_270);
    local_218._8_8_ = CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
    pWStack_200 = (WirePointer *)CONCAT44(local_1d8._28_4_,local_1d8._24_4_);
    local_1f8 = (void *)local_1d8._32_8_;
    pWStack_1f0 = pWStack_1b0;
    local_208 = (SegmentReader *)local_1d8._16_8_;
    local_218._0_8_ = local_1d8._0_8_;
    capnp::schema::Node::Struct::Reader::getFields((Reader *)local_268,(Reader *)local_218);
    local_220 = uStack_250;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x38,FAILED,
               "(schema.getFields().size()) == (schema.getProto().getStruct().getFields().size())",
               "schema.getFields().size(), schema.getProto().getStruct().getFields().size()",
               &local_21c,&local_220);
    kj::_::Debug::Fault::fatal(&local_228);
  }
  StructSchema::getFields((FieldList *)local_198,(StructSchema *)&local_270);
  ListReader::getStructElement((StructReader *)(local_268 + 0x10),(ListReader *)(local_198 + 8),0);
  local_268._0_8_ = local_198;
  local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
  bVar5 = local_234 == 0;
  auStack_190._8_8_ = local_240;
  if (bVar5) {
    auStack_190._8_8_ = (void *)0x0;
  }
  auStack_190._16_4_ = 0x7fffffff;
  if (!bVar5) {
    auStack_190._16_4_ = local_230;
  }
  local_198._0_4_ = 0;
  local_198._4_4_ = 0;
  auStack_190._0_4_ = 0;
  auStack_190._4_4_ = 0;
  if (!bVar5) {
    local_198._0_4_ = local_268._16_4_;
    local_198._4_4_ = uStack_254;
    auStack_190._0_4_ = uStack_250;
    auStack_190._4_4_ = BStack_24c;
  }
  RVar6 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_198,(void *)0x0,0);
  if (RVar6.super_StringPtr.content.size_ == 10) {
    if (((char)RVar6.super_StringPtr.content.ptr[1] != 'd' ||
        *RVar6.super_StringPtr.content.ptr != 0x6c65694664696f76) && kj::_::Debug::minSeverity < 3)
    goto LAB_002ae120;
  }
  else {
    if (2 < kj::_::Debug::minSeverity) goto LAB_002ae1d2;
LAB_002ae120:
    bVar5 = local_234 == 0;
    auStack_190._8_8_ = local_240;
    if (bVar5) {
      auStack_190._8_8_ = (void *)0x0;
    }
    auStack_190._16_4_ = 0x7fffffff;
    if (!bVar5) {
      auStack_190._16_4_ = local_230;
    }
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    auStack_190._0_4_ = 0;
    auStack_190._4_4_ = 0;
    if (!bVar5) {
      local_198._0_4_ = local_268._16_4_;
      local_198._4_4_ = uStack_254;
      auStack_190._0_4_ = uStack_250;
      auStack_190._4_4_ = BStack_24c;
    }
    _local_198 = (ArrayPtr<const_char>)
                 PointerReader::getBlob<capnp::Text>((PointerReader *)local_198,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[63],char_const(&)[10],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x3a,ERROR,
               "\"failed: expected \" \"(\\\"voidField\\\") == (field.getProto().getName())\", \"voidField\", field.getProto().getName()"
               ,(char (*) [63])"failed: expected (\"voidField\") == (field.getProto().getName())",
               (char (*) [10])"voidField",(Reader *)local_198);
  }
  if (((_func_int **)local_268._0_8_ != local_270._vptr_CapTableReader) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x3b,ERROR,"\"failed: expected \" \"field.getContainingStruct() == schema\"",
               (char (*) [55])"failed: expected field.getContainingStruct() == schema");
  }
LAB_002ae1d2:
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  StructSchema::getFieldByName((Field *)local_218,(StructSchema *)&local_270,name);
  if ((local_218._8_4_ != local_268._8_4_ || local_218._0_8_ != local_268._0_8_) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"lookup == field\"",
               (char (*) [33])"failed: expected lookup == field");
  }
  StructSchema::getFields((FieldList *)local_1d8,(StructSchema *)&local_270);
  uVar1 = local_1d8._0_8_;
  ListReader::getStructElement((StructReader *)(auStack_190 + 8),(ListReader *)(local_1d8 + 8),1);
  if (((local_218._0_8_ == uVar1) && (local_218._8_4_ == 1)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x3f,ERROR,"\"failed: expected \" \"lookup != schema.getFields()[1]\"",
               (char (*) [49])"failed: expected lookup != schema.getFields()[1]");
  }
  if (((0x80 < local_1e8) && ((*(byte *)((long)local_1f8 + 0x10) & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x40,ERROR,
               "\"failed: expected \" \"!(lookup.getProto().getSlot().getHadExplicitDefault())\"",
               (char (*) [72])
               "failed: expected !(lookup.getProto().getSlot().getHadExplicitDefault())");
  }
  name_00.content.size_ = 0xb;
  name_00.content.ptr = "int32Field";
  StructSchema::getFieldByName((Field *)local_198,(StructSchema *)&local_270,name_00);
  if (((0x80 < (uint)auStack_190._40_4_) &&
      ((*(byte *)(CONCAT44(auStack_190._28_4_,auStack_190._24_4_) + 0x10) & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[101]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x42,ERROR,
               "\"failed: expected \" \"!(schema.getFieldByName(\\\"int32Field\\\").getProto().getSlot().getHadExplicitDefault())\""
               ,(char (*) [101])
                "failed: expected !(schema.getFieldByName(\"int32Field\").getProto().getSlot().getHadExplicitDefault())"
              );
  }
  local_1d8._0_8_ = (long)schemas::s_eb3f9ebe98c73cb6 + 0x48;
  name_01.content.size_ = 0xb;
  name_01.content.ptr = "int32Field";
  StructSchema::getFieldByName((Field *)local_198,(StructSchema *)local_1d8,name_01);
  if ((((uint)auStack_190._40_4_ < 0x81) ||
      ((*(byte *)(CONCAT44(auStack_190._28_4_,auStack_190._24_4_) + 0x10) & 1) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[121]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x45,ERROR,
               "\"failed: expected \" \"Schema::from<TestDefaults>().getFieldByName(\\\"int32Field\\\") .getProto().getSlot().getHadExplicitDefault()\""
               ,(char (*) [121])
                "failed: expected Schema::from<TestDefaults>().getFieldByName(\"int32Field\") .getProto().getSlot().getHadExplicitDefault()"
              );
  }
  name_02.content.size_ = 0xc;
  name_02.content.ptr = "noSuchField";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)local_198,(StructSchema *)&local_270,name_02);
  if ((local_198[0] == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x47,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"noSuchField\\\") == nullptr\"",
               (char (*) [66])"failed: expected schema.findFieldByName(\"noSuchField\") == nullptr")
    ;
  }
  name_03.content.size_ = 0xb;
  name_03.content.ptr = "int32Field";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)local_198,(StructSchema *)&local_270,name_03);
  if ((local_198[0] == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x49,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"int32Field\\\") != nullptr\"",
               (char (*) [65])"failed: expected schema.findFieldByName(\"int32Field\") != nullptr");
  }
  name_04.content.size_ = 0xc;
  name_04.content.ptr = "float32List";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)local_198,(StructSchema *)&local_270,name_04);
  if ((local_198[0] == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x4a,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"float32List\\\") != nullptr\"",
               (char (*) [66])"failed: expected schema.findFieldByName(\"float32List\") != nullptr")
    ;
  }
  name_05.content.size_ = 9;
  name_05.content.ptr = "dataList";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)local_198,(StructSchema *)&local_270,name_05);
  if ((local_198[0] == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x4b,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"dataList\\\") != nullptr\"",
               (char (*) [63])"failed: expected schema.findFieldByName(\"dataList\") != nullptr");
  }
  name_06.content.size_ = 10;
  name_06.content.ptr = "textField";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)local_198,(StructSchema *)&local_270,name_06);
  if ((local_198[0] == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x4c,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"textField\\\") != nullptr\"",
               (char (*) [64])"failed: expected schema.findFieldByName(\"textField\") != nullptr");
  }
  name_07.content.size_ = 0xc;
  name_07.content.ptr = "structField";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)local_198,(StructSchema *)&local_270,name_07);
  if ((local_198[0] == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x4d,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"structField\\\") != nullptr\"",
               (char (*) [66])"failed: expected schema.findFieldByName(\"structField\") != nullptr")
    ;
  }
  return;
}

Assistant:

TEST(Schema, Structs) {
  StructSchema schema = Schema::from<TestAllTypes>();

  EXPECT_EQ(typeId<TestAllTypes>(), schema.getProto().getId());

  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>());
  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) != schema);
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>());
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == schema);
  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestDefaults>()));

  EXPECT_TRUE(schema.asStruct() == schema);
  EXPECT_NONFATAL_FAILURE(schema.asEnum());
  EXPECT_NONFATAL_FAILURE(schema.asInterface());

  ASSERT_EQ(schema.getFields().size(), schema.getProto().getStruct().getFields().size());
  StructSchema::Field field = schema.getFields()[0];
  EXPECT_EQ("voidField", field.getProto().getName());
  EXPECT_TRUE(field.getContainingStruct() == schema);

  StructSchema::Field lookup = schema.getFieldByName("voidField");
  EXPECT_TRUE(lookup == field);
  EXPECT_TRUE(lookup != schema.getFields()[1]);
  EXPECT_FALSE(lookup.getProto().getSlot().getHadExplicitDefault());

  EXPECT_FALSE(schema.getFieldByName("int32Field").getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(Schema::from<TestDefaults>().getFieldByName("int32Field")
      .getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(schema.findFieldByName("noSuchField") == nullptr);

  EXPECT_TRUE(schema.findFieldByName("int32Field") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("float32List") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("dataList") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("textField") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("structField") != nullptr);
}